

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O1

ParseResult * __thiscall
trivialre::re_compiler::C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>
::ParseAlt(ParseResult *__return_storage_ptr__,
          C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this,
          string_view str)

{
  undefined8 uVar1;
  string_view str_00;
  undefined8 local_148;
  undefined8 uStack_140;
  code *local_138;
  _Invoker_type p_Stack_130;
  _Storage<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false>
  local_128;
  char local_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  _Storage<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false>
  local_e8;
  char local_c8;
  size_t local_c0;
  char *pcStack_b8;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  ParseRun((ParseResult *)&local_e8._M_value,this,str);
  if ((local_c0 == 0) || (*pcStack_b8 != '|')) {
    (__return_storage_ptr__->first).
    super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
    .
    super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ._M_engaged = false;
    if (local_c8 == '\x01') {
      *(undefined8 *)
       &(__return_storage_ptr__->first).
        super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
        .
        super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
        ._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 0x10) = 0;
      (__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_payload._M_value._M_invoker = local_e8._M_value._M_invoker;
      if (local_e8._M_value.super__Function_base._M_manager != (_Manager_type)0x0) {
        *(undefined8 *)
         &(__return_storage_ptr__->first).
          super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
          .
          super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
          ._M_payload = local_e8._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->first).
                 super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                 ._M_payload + 8) = local_e8._8_8_;
        *(_Manager_type *)
         ((long)&(__return_storage_ptr__->first).
                 super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                 ._M_payload + 0x10) = local_e8._M_value.super__Function_base._M_manager;
        local_e8._M_value.super__Function_base._M_manager = (_Manager_type)0x0;
        local_e8._M_value._M_invoker = (_Invoker_type)0x0;
      }
      (__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_engaged = true;
    }
    (__return_storage_ptr__->second)._M_len = local_c0;
    (__return_storage_ptr__->second)._M_str = pcStack_b8;
LAB_0010f45f:
    std::
    _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                *)&local_e8._M_value);
    return __return_storage_ptr__;
  }
  if (local_c8 == '\0') {
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    p_Stack_50 = std::
                 _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
               ::_M_manager;
    std::
    _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                *)&local_e8._M_value);
    local_e8._0_8_ = 0;
    local_e8._8_8_ = 0;
    local_e8._M_value.super__Function_base._M_manager = (_Manager_type)0x0;
    local_e8._M_value._M_invoker = p_Stack_50;
    if (local_58 != (_Manager_type)0x0) {
      local_e8._0_8_ = local_68._M_unused._M_object;
      local_e8._8_8_ = local_68._8_8_;
      local_e8._M_value.super__Function_base._M_manager = local_58;
      local_58 = (_Manager_type)0x0;
      p_Stack_50 = (_Invoker_type)0x0;
    }
    local_c8 = '\x01';
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  if (local_c0 == 0) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0);
  }
  else {
    str_00._M_str = pcStack_b8 + 1;
    str_00._M_len = local_c0 - 1;
    ParseAlt((ParseResult *)&local_128._M_value,this,str_00);
    if (local_108 == '\0') {
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      p_Stack_50 = std::
                   _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                 ::_M_manager;
      std::
      _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                  *)&local_128._M_value);
      local_128._0_8_ = (void *)0x0;
      local_128._8_8_ = 0;
      local_128._M_value.super__Function_base._M_manager = (_Manager_type)0x0;
      local_128._M_value._M_invoker = p_Stack_50;
      if (local_58 != (_Manager_type)0x0) {
        local_128._0_8_ = local_68._M_unused._M_object;
        local_128._8_8_ = local_68._8_8_;
        local_128._M_value.super__Function_base._M_manager = local_58;
        local_58 = (_Manager_type)0x0;
        p_Stack_50 = (_Invoker_type)0x0;
      }
      local_108 = '\x01';
      if (local_58 != (_Manager_type)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
    }
    uVar1 = local_e8._M_value._M_invoker;
    local_30 = local_128._M_value._M_invoker;
    if (local_c8 != '\0') {
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      local_98 = (_Manager_type)0x0;
      p_Stack_90 = local_e8._M_value._M_invoker;
      if (local_e8._M_value.super__Function_base._M_manager != (_Manager_type)0x0) {
        local_a8._M_unused._M_object = (void *)local_e8._0_8_;
        local_a8._8_8_ = local_e8._8_8_;
        local_98 = local_e8._M_value.super__Function_base._M_manager;
        local_e8._M_value.super__Function_base._M_manager = (_Manager_type)0x0;
        local_e8._M_value._M_invoker = (_Invoker_type)0x0;
      }
      if (local_108 == '\0') {
        std::__throw_bad_optional_access();
      }
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_78 = (_Manager_type)0x0;
      p_Stack_70 = local_128._M_value._M_invoker;
      if (local_128._M_value.super__Function_base._M_manager != (_Manager_type)0x0) {
        local_88._M_unused._M_object = (void *)local_128._0_8_;
        local_88._8_8_ = local_128._8_8_;
        local_78 = local_128._M_value.super__Function_base._M_manager;
        local_128._M_value.super__Function_base._M_manager = (_Manager_type)0x0;
        local_128._M_value._M_invoker = (_Invoker_type)0x0;
      }
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_58 = (_Manager_type)0x0;
      p_Stack_50 = (_Invoker_type)uVar1;
      if (local_98 != (_Manager_type)0x0) {
        local_68._M_unused._M_object = local_a8._M_unused._M_object;
        local_68._8_8_ = local_a8._8_8_;
        local_58 = local_98;
        local_98 = (_Manager_type)0x0;
        p_Stack_90 = (_Invoker_type)0x0;
      }
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_38 = (_Manager_type)0x0;
      if (local_78 != (_Manager_type)0x0) {
        local_48._M_unused._M_object = local_88._M_unused._M_object;
        local_48._8_8_ = local_88._8_8_;
        local_38 = local_78;
        local_78 = (_Manager_type)0x0;
        p_Stack_70 = (_Invoker_type)0x0;
      }
      std::
      function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>
      ::
      function<trivialre::matchers::MatcherBuilder::Alt(std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>)::_lambda(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)_1_,void>
                ((function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>
                  *)&local_148,(anon_class_64_2_208f5e76 *)&local_68);
      if (local_38 != (_Manager_type)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      if (local_58 != (_Manager_type)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      *(undefined8 *)
       &(__return_storage_ptr__->first).
        super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
        .
        super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
        ._M_payload = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 8) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->first).
               super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
               .
               super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
               ._M_payload + 0x10) = 0;
      (__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_payload._M_value._M_invoker = p_Stack_130;
      if (local_138 != (code *)0x0) {
        *(undefined8 *)
         &(__return_storage_ptr__->first).
          super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
          .
          super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
          ._M_payload = local_148;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->first).
                 super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                 ._M_payload + 8) = uStack_140;
        *(code **)((long)&(__return_storage_ptr__->first).
                          super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                          ._M_payload + 0x10) = local_138;
        local_138 = (code *)0x0;
        p_Stack_130 = (_Invoker_type)0x0;
      }
      (__return_storage_ptr__->first).
      super__Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true,_false,_false>
      .
      super__Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ._M_engaged = true;
      *(undefined4 *)&(__return_storage_ptr__->second)._M_len = local_100;
      *(undefined4 *)((long)&(__return_storage_ptr__->second)._M_len + 4) = uStack_fc;
      *(undefined4 *)&(__return_storage_ptr__->second)._M_str = uStack_f8;
      *(undefined4 *)((long)&(__return_storage_ptr__->second)._M_str + 4) = uStack_f4;
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,3);
      }
      if (local_78 != (_Manager_type)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (local_98 != (_Manager_type)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      std::
      _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
      ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                  *)&local_128._M_value);
      goto LAB_0010f45f;
    }
  }
  std::__throw_bad_optional_access();
}

Assistant:

ParseResult ParseAlt(std::string_view str) {
    auto [maybe_left, str_l] = ParseRun(str);
    if (IsCharAt(str_l, 0, '|')) {
      if (!maybe_left) {
        maybe_left.emplace(builder.Any());
      }
      auto [maybe_right, str_r] = ParseAlt(str_l.substr(1));
      if (!maybe_right) {
        maybe_right.emplace(builder.Any());
      }
      return {builder.Alt(std::move(maybe_left.value()), std::move(maybe_right.value())), str_r};
    }
    return {std::move(maybe_left), str_l};
  }